

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * MyGame_Example_Test_parse_json_struct_inline
                 (flatcc_json_parser_t *ctx,char *buf,char *end,void *struct_base)

{
  byte bVar1;
  size_t n;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  int8_t val;
  int more;
  uint64_t value;
  ushort local_4a;
  int local_48;
  int local_44;
  uint64_t local_40;
  ushort *local_38;
  
  local_38 = (ushort *)struct_base;
  if ((buf == end) || (*buf != '{')) {
    local_48 = 0;
    pbVar6 = (byte *)flatcc_json_parser_set_error(ctx,buf,end,0x15);
    goto LAB_00110668;
  }
  pbVar7 = (byte *)(buf + 1);
  if ((long)end - (long)pbVar7 < 2) {
LAB_0011061a:
    pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
  }
  else if ((char)*pbVar7 < '!') {
    if ((*pbVar7 != 0x20) || (buf[2] < '!')) goto LAB_0011061a;
    pbVar7 = (byte *)(buf + 2);
  }
  if ((pbVar7 == (byte *)end) || (*pbVar7 != 0x7d)) {
    local_48 = 1;
    pbVar6 = pbVar7;
    goto LAB_00110668;
  }
  local_48 = 0;
  pbVar6 = pbVar7 + 1;
  if (1 < (long)end - (long)pbVar6) {
    if (' ' < (char)*pbVar6) goto LAB_00110668;
    if ((*pbVar6 == 0x20) && (' ' < (char)pbVar7[2])) {
      pbVar6 = pbVar7 + 2;
      goto LAB_00110668;
    }
  }
  pbVar6 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar6,end);
LAB_00110668:
  if (local_48 != 0) {
    do {
      if (pbVar6 != (byte *)end) {
        if (*pbVar6 == 0x2e) {
          pbVar6 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar6,end,5);
        }
        else if (*pbVar6 == 0x22) {
          pbVar6 = pbVar6 + 1;
          ctx->unquoted = 0;
        }
        else {
          ctx->unquoted = 1;
        }
      }
      uVar2 = (long)end - (long)pbVar6;
      if (uVar2 < 8) {
        uVar5 = 0;
        switch(uVar2) {
        case 7:
          uVar5 = (long)(char)pbVar6[6] << 8;
        case 6:
          uVar5 = uVar5 | (long)(char)pbVar6[5] << 0x10;
        case 5:
          uVar5 = uVar5 | (long)(char)pbVar6[4] << 0x18;
        case 4:
          uVar5 = uVar5 | (long)(char)pbVar6[3] << 0x20;
        case 3:
          uVar5 = uVar5 | (long)(char)pbVar6[2] << 0x28;
        case 2:
          uVar5 = uVar5 | (long)(char)pbVar6[1] << 0x30;
        case 1:
          uVar5 = uVar5 | (ulong)*pbVar6 << 0x38;
        }
      }
      else {
        uVar5 = *(long *)pbVar6 << 0x38;
      }
      pbVar7 = pbVar6;
      if ((uVar5 & 0xff00000000000000) == 0x6100000000000000) {
        if (1 < (long)uVar2) {
          bVar1 = pbVar6[1];
          if (ctx->unquoted == 0) {
            if (bVar1 == 0x22) {
              pbVar8 = pbVar6 + 2;
              goto LAB_00110820;
            }
          }
          else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
            pbVar8 = pbVar6 + 1;
            ctx->unquoted = 0;
LAB_00110820:
            if ((long)end - (long)pbVar8 < 2) {
LAB_001108a7:
              pbVar8 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar8,end);
            }
            else if ((char)*pbVar8 < '!') {
              if ((*pbVar8 != 0x20) || ((char)pbVar8[1] < '!')) goto LAB_001108a7;
              pbVar8 = pbVar8 + 1;
            }
            if ((pbVar8 == (byte *)end) || (*pbVar8 != 0x3a)) {
              pbVar7 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar8,end,4);
            }
            else {
              pbVar7 = pbVar8 + 1;
              if ((long)end - (long)pbVar7 < 2) {
LAB_001109fe:
                pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
              }
              else if ((char)*pbVar7 < '!') {
                if ((*pbVar7 != 0x20) || ((char)pbVar8[2] < '!')) goto LAB_001109fe;
                pbVar7 = pbVar8 + 2;
              }
            }
          }
        }
        if (pbVar6 == pbVar7) goto LAB_00110a7f;
        local_4a = 0;
        local_40 = 0;
        local_44 = 0;
        pbVar6 = pbVar7;
        if ((pbVar7 != (byte *)end) &&
           (pbVar6 = (byte *)flatcc_json_parser_integer(ctx,(char *)pbVar7,end,&local_44,&local_40),
           pbVar6 != pbVar7)) {
          if (local_44 == 0) {
            uVar2 = local_40;
            if (local_40 < 0x8000) goto LAB_00110ab5;
            iVar4 = 7;
          }
          else {
            if (local_40 < 0x8001) {
              uVar2 = -local_40;
LAB_00110ab5:
              local_4a = (ushort)uVar2;
              goto LAB_00110aba;
            }
            iVar4 = 8;
          }
          pbVar6 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar6,end,iVar4);
        }
LAB_00110aba:
        if ((pbVar7 != pbVar6) ||
           (pbVar7 = (byte *)flatcc_json_parser_symbolic_int16
                                       (ctx,(char *)pbVar6,end,
                                        MyGame_Example_Test_parse_json_struct_inline::
                                        symbolic_parsers_1,(int16_t *)&local_4a),
           bVar9 = pbVar7 != pbVar6, pbVar6 = pbVar7, pbVar7 != (byte *)end && bVar9)) {
          *local_38 = local_4a;
          goto LAB_00110b02;
        }
LAB_00110af1:
        bVar9 = false;
LAB_00110b04:
        if (!bVar9) {
          pcVar3 = flatcc_json_parser_set_error(ctx,(char *)pbVar7,end,0x23);
          return pcVar3;
        }
      }
      else {
        if ((uVar5 & 0xff00000000000000) == 0x6200000000000000) {
          if (1 < (long)uVar2) {
            bVar1 = pbVar6[1];
            if (ctx->unquoted == 0) {
              if (bVar1 == 0x22) {
                pbVar8 = pbVar6 + 2;
                goto LAB_001107f3;
              }
            }
            else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
              pbVar8 = pbVar6 + 1;
              ctx->unquoted = 0;
LAB_001107f3:
              if ((long)end - (long)pbVar8 < 2) {
LAB_00110842:
                pbVar8 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar8,end);
              }
              else if ((char)*pbVar8 < '!') {
                if ((*pbVar8 != 0x20) || ((char)pbVar8[1] < '!')) goto LAB_00110842;
                pbVar8 = pbVar8 + 1;
              }
              if ((pbVar8 == (byte *)end) || (*pbVar8 != 0x3a)) {
                pbVar7 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar8,end,4);
              }
              else {
                pbVar7 = pbVar8 + 1;
                if ((long)end - (long)pbVar7 < 2) {
LAB_0011090f:
                  pbVar7 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)pbVar7,end);
                }
                else if ((char)*pbVar7 < '!') {
                  if ((*pbVar7 != 0x20) || ((char)pbVar8[2] < '!')) goto LAB_0011090f;
                  pbVar7 = pbVar8 + 2;
                }
              }
            }
          }
          if (pbVar6 != pbVar7) {
            local_4a = local_4a & 0xff00;
            local_40 = 0;
            local_44 = 0;
            pbVar6 = pbVar7;
            if ((pbVar7 != (byte *)end) &&
               (pbVar6 = (byte *)flatcc_json_parser_integer
                                           (ctx,(char *)pbVar7,end,&local_44,&local_40),
               pbVar6 != pbVar7)) {
              if (local_44 == 0) {
                uVar2 = local_40;
                if (local_40 < 0x80) goto LAB_001109ae;
                iVar4 = 7;
              }
              else {
                if (local_40 < 0x81) {
                  uVar2 = -local_40;
LAB_001109ae:
                  local_4a = CONCAT11(local_4a._1_1_,(char)uVar2);
                  goto LAB_001109b2;
                }
                iVar4 = 8;
              }
              pbVar6 = (byte *)flatcc_json_parser_set_error(ctx,(char *)pbVar6,end,iVar4);
            }
LAB_001109b2:
            if ((pbVar7 == pbVar6) &&
               (pbVar7 = (byte *)flatcc_json_parser_symbolic_int8
                                           (ctx,(char *)pbVar6,end,
                                            MyGame_Example_Test_parse_json_struct_inline::
                                            symbolic_parsers,(int8_t *)&local_4a),
               bVar9 = pbVar7 == pbVar6, pbVar6 = pbVar7, pbVar7 == (byte *)end || bVar9))
            goto LAB_00110af1;
            *(undefined1 *)(local_38 + 1) = (undefined1)local_4a;
LAB_00110b02:
            bVar9 = true;
            pbVar7 = pbVar6;
            goto LAB_00110b04;
          }
        }
LAB_00110a7f:
        pbVar7 = (byte *)flatcc_json_parser_unmatched_symbol(ctx,(char *)pbVar7,end);
      }
      pbVar6 = (byte *)flatcc_json_parser_object_end(ctx,(char *)pbVar7,end,&local_48);
    } while (local_48 != 0);
  }
  return (char *)pbVar6;
}

Assistant:

static const char *MyGame_Example_Test_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)
{
    int more;
    flatcc_builder_ref_t ref;
    void *pval;
    const char *mark;
    uint64_t w;

    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if ((w & 0xff00000000000000) == 0x6200000000000000) { /* "b" */
            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
            if (mark != buf) {
                int8_t val = 0;
                static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                        monster_test_local_MyGame_Example_json_parser_enum,
                        monster_test_global_json_parser_enum, 0 };
                pval = (void *)((size_t)struct_base + 2);
                buf = flatcc_json_parser_int8(ctx, (mark = buf), end, &val);
                if (mark == buf) {
                    buf = flatcc_json_parser_symbolic_int8(ctx, (mark = buf), end, symbolic_parsers, &val);
                    if (buf == mark || buf == end) goto failed;
                }
                flatbuffers_int8_write_to_pe(pval, val);
            } else {
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            }
        } else { /* "b" */
            if ((w & 0xff00000000000000) == 0x6100000000000000) { /* "a" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                if (mark != buf) {
                    int16_t val = 0;
                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                            monster_test_local_MyGame_Example_json_parser_enum,
                            monster_test_global_json_parser_enum, 0 };
                    pval = (void *)((size_t)struct_base + 0);
                    buf = flatcc_json_parser_int16(ctx, (mark = buf), end, &val);
                    if (mark == buf) {
                        buf = flatcc_json_parser_symbolic_int16(ctx, (mark = buf), end, symbolic_parsers, &val);
                        if (buf == mark || buf == end) goto failed;
                    }
                    flatbuffers_int16_write_to_pe(pval, val);
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "a" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "a" */
        } /* "b" */
        buf = flatcc_json_parser_object_end(ctx, buf, end , &more);
    }
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}